

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * tinyxml2::XMLUtil::GetCharacterRef(char *p,char *value,int *length)

{
  uint digitScaled_1;
  uint digit_1;
  char *q_1;
  uint digitScaled;
  uint digit;
  char *q;
  long lStack_38;
  uint mult;
  ptrdiff_t delta;
  unsigned_long ucs;
  int *length_local;
  char *value_local;
  char *p_local;
  
  *length = 0;
  if ((p[1] != '#') || (p[2] == '\0')) {
    return p + 1;
  }
  delta = 0;
  q._4_4_ = 1;
  if (p[2] == 'x') {
    if (p[3] == '\0') {
      return (char *)0x0;
    }
    _digitScaled = strchr(p + 3,0x3b);
    if (_digitScaled == (char *)0x0) {
      return (char *)0x0;
    }
    lStack_38 = (long)_digitScaled - (long)p;
    while (_digitScaled = _digitScaled + -1, *_digitScaled != 'x') {
      if ((*_digitScaled < '0') || ('9' < *_digitScaled)) {
        if ((*_digitScaled < 'a') || ('f' < *_digitScaled)) {
          if ((*_digitScaled < 'A') || ('F' < *_digitScaled)) {
            return (char *)0x0;
          }
          q_1._4_4_ = *_digitScaled + -0x37;
        }
        else {
          q_1._4_4_ = *_digitScaled + -0x57;
        }
      }
      else {
        q_1._4_4_ = *_digitScaled + -0x30;
      }
      delta = (ulong)(uint)(q._4_4_ * q_1._4_4_) + delta;
      q._4_4_ = q._4_4_ << 4;
    }
  }
  else {
    if (p[2] == '\0') {
      return (char *)0x0;
    }
    _digitScaled_1 = strchr(p + 2,0x3b);
    if (_digitScaled_1 == (char *)0x0) {
      return (char *)0x0;
    }
    lStack_38 = (long)_digitScaled_1 - (long)p;
    while (_digitScaled_1 = _digitScaled_1 + -1, *_digitScaled_1 != '#') {
      if ((*_digitScaled_1 < '0') || ('9' < *_digitScaled_1)) {
        return (char *)0x0;
      }
      delta = (ulong)(uint)(q._4_4_ * (*_digitScaled_1 + -0x30)) + delta;
      q._4_4_ = q._4_4_ * 10;
    }
  }
  ConvertUTF32ToUTF8(delta,value,length);
  return p + lStack_38 + 1;
}

Assistant:

const char* XMLUtil::GetCharacterRef( const char* p, char* value, int* length )
{
    // Presume an entity, and pull it out.
    *length = 0;

    if ( *(p+1) == '#' && *(p+2) ) {
        unsigned long ucs = 0;
        TIXMLASSERT( sizeof( ucs ) >= 4 );
        ptrdiff_t delta = 0;
        unsigned mult = 1;
        static const char SEMICOLON = ';';

        if ( *(p+2) == 'x' ) {
            // Hexadecimal.
            const char* q = p+3;
            if ( !(*q) ) {
                return 0;
            }

            q = strchr( q, SEMICOLON );

            if ( !q ) {
                return 0;
            }
            TIXMLASSERT( *q == SEMICOLON );

            delta = q-p;
            --q;

            while ( *q != 'x' ) {
                unsigned int digit = 0;

                if ( *q >= '0' && *q <= '9' ) {
                    digit = *q - '0';
                }
                else if ( *q >= 'a' && *q <= 'f' ) {
                    digit = *q - 'a' + 10;
                }
                else if ( *q >= 'A' && *q <= 'F' ) {
                    digit = *q - 'A' + 10;
                }
                else {
                    return 0;
                }
                TIXMLASSERT( digit < 16 );
                TIXMLASSERT( digit == 0 || mult <= UINT_MAX / digit );
                const unsigned int digitScaled = mult * digit;
                TIXMLASSERT( ucs <= ULONG_MAX - digitScaled );
                ucs += digitScaled;
                TIXMLASSERT( mult <= UINT_MAX / 16 );
                mult *= 16;
                --q;
            }
        }
        else {
            // Decimal.
            const char* q = p+2;
            if ( !(*q) ) {
                return 0;
            }

            q = strchr( q, SEMICOLON );

            if ( !q ) {
                return 0;
            }
            TIXMLASSERT( *q == SEMICOLON );

            delta = q-p;
            --q;

            while ( *q != '#' ) {
                if ( *q >= '0' && *q <= '9' ) {
                    const unsigned int digit = *q - '0';
                    TIXMLASSERT( digit < 10 );
                    TIXMLASSERT( digit == 0 || mult <= UINT_MAX / digit );
                    const unsigned int digitScaled = mult * digit;
                    TIXMLASSERT( ucs <= ULONG_MAX - digitScaled );
                    ucs += digitScaled;
                }
                else {
                    return 0;
                }
                TIXMLASSERT( mult <= UINT_MAX / 10 );
                mult *= 10;
                --q;
            }
        }
        // convert the UCS to UTF-8
        ConvertUTF32ToUTF8( ucs, value, length );
        return p + delta + 1;
    }
    return p+1;
}